

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.c
# Opt level: O1

LR des_round(LR in,des_keysched *sched,size_t round)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  uint local_40;
  
  uVar2 = in.R;
  uVar1 = sched->k7531[round] ^ uVar2;
  uVar5 = (uVar2 << 4 | uVar2 >> 0x1c) ^ sched->k6420[round];
  uVar2 = uVar5 & 0xfc00fc | 0xff00ff00;
  uVar3 = uVar5 >> 8 & 0xfc00fc | 0xff00ff00;
  uVar11 = uVar1 & 0xfc00fc | 0xff00ff00;
  uVar7 = uVar1 >> 8 & 0xfc00fc | 0xff00ff00;
  uVar4 = 0;
  uVar9 = 0xfffffffffffffff0;
  uVar6 = 0;
  uVar10 = 0;
  uVar8 = 0;
  do {
    uVar8 = uVar8 ^ *(uint *)((long)&DAT_00183f50 + uVar9) & uVar2;
    uVar2 = uVar2 + 0x80008;
    uVar10 = uVar10 ^ *(uint *)((long)&DAT_00183f54 + uVar9) & uVar3;
    uVar3 = uVar3 + 0x80008;
    uVar6 = uVar6 ^ *(uint *)((long)&DAT_00183f58 + uVar9) & uVar11;
    uVar11 = uVar11 + 0x80008;
    uVar4 = uVar4 ^ *(uint *)((long)&DAT_00183f5c + uVar9) & uVar7;
    uVar7 = uVar7 + 0x80008;
    uVar9 = uVar9 + 0x10;
  } while (uVar9 < 0x1f0);
  uVar1 = ((uVar1 & 0x40004) * 0x3c00 & uVar6 << 4 ^ uVar6) >> 8 & 0xf000f0 |
          ((uVar5 >> 8 & 0x40004) * 0x3c00 & uVar10 << 4 ^ uVar10) >> 4 & 0xf000f00 |
          ((uVar1 >> 8 & 0x40004) * 0x3c00 & uVar4 << 4 ^ uVar4) & 0xf000f000;
  uVar2 = ((uVar5 & 0x40004) * 0x3c00 & uVar8 << 4 ^ uVar8) >> 0xc & 0xf000f | uVar1;
  uVar1 = (uVar1 >> 4 ^ uVar2) & 0x7030702;
  uVar1 = uVar1 << 4 ^ uVar2 ^ uVar1;
  uVar2 = (uVar1 >> 8 ^ uVar1) & 0x4e009e;
  uVar2 = uVar2 << 8 ^ uVar1 ^ uVar2;
  uVar1 = (uVar2 >> 0x10 ^ uVar2) & 0xd9d3;
  uVar2 = uVar1 << 0x10 ^ uVar2;
  uVar1 = uVar1 ^ uVar2;
  uVar2 = (uVar1 >> 4 ^ uVar2) & 0x5040004;
  uVar2 = uVar2 << 4 ^ uVar1 ^ uVar2;
  uVar1 = (uVar1 >> 1 ^ uVar2) & 0x4045015;
  local_40 = in.L;
  return (LR)(((ulong)(uVar1 * 2 ^ uVar2 ^ local_40 ^ uVar1) << 0x20) + ((ulong)in >> 0x20));
}

Assistant:

static inline LR des_round(LR in, const des_keysched *sched, size_t round)
{
    LR out;
    out.L = in.R;
    out.R = in.L ^ des_f(in.R, sched->k7531[round], sched->k6420[round]);
    return out;
}